

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_measures.cc
# Opt level: O1

S2Point * S2::GetCentroid(S2Point *__return_storage_ptr__,S2Shape *shape)

{
  int iVar1;
  uint uVar2;
  size_type in_RCX;
  int chain_id;
  ulong uVar3;
  VType VVar4;
  VType VVar5;
  VType VVar6;
  S2PointLoopSpan loop;
  S2PointSpan polyline;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> local_78;
  S2Point local_60 [2];
  
  __return_storage_ptr__->c_[2] = 0.0;
  __return_storage_ptr__->c_[0] = 0.0;
  __return_storage_ptr__->c_[1] = 0.0;
  local_78.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = (*shape->_vptr_S2Shape[4])(shape);
  uVar2 = (*shape->_vptr_S2Shape[6])(shape);
  VVar4 = __return_storage_ptr__->c_[0];
  if (0 < (int)uVar2) {
    VVar5 = __return_storage_ptr__->c_[1];
    VVar6 = __return_storage_ptr__->c_[2];
    uVar3 = 0;
    do {
      chain_id = (int)uVar3;
      if (iVar1 == 1) {
        GetChainVertices(shape,chain_id,&local_78);
        polyline.ptr_ =
             (pointer)(((long)local_78.
                              super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_78.
                              super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
        ;
        polyline.len_ = in_RCX;
        GetCentroid(local_60,(S2 *)local_78.
                                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,polyline);
      }
      else if (iVar1 == 0) {
        (*shape->_vptr_S2Shape[3])(local_60,shape,uVar3);
      }
      else {
        GetChainVertices(shape,chain_id,&local_78);
        loop.super_S2PointSpan.len_ =
             ((long)local_78.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_78.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        loop.super_S2PointSpan.ptr_ =
             local_78.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
             .super__Vector_impl_data._M_start;
        GetCentroid(local_60,loop);
      }
      VVar4 = local_60[0].c_[0] + VVar4;
      VVar5 = local_60[0].c_[1] + VVar5;
      VVar6 = local_60[0].c_[2] + VVar6;
      uVar3 = (ulong)(chain_id + 1U);
    } while (uVar2 != chain_id + 1U);
    __return_storage_ptr__->c_[1] = VVar5;
    __return_storage_ptr__->c_[2] = VVar6;
  }
  __return_storage_ptr__->c_[0] = VVar4;
  if ((S2 *)local_78.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
            super__Vector_impl_data._M_start != (S2 *)0x0) {
    operator_delete(local_78.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point GetCentroid(const S2Shape& shape) {
  S2Point centroid;
  vector<S2Point> vertices;
  int dimension = shape.dimension();
  int num_chains = shape.num_chains();
  for (int chain_id = 0; chain_id < num_chains; ++chain_id) {
    switch (dimension) {
      case 0:
        centroid += shape.edge(chain_id).v0;
        break;
      case 1:
        GetChainVertices(shape, chain_id, &vertices);
        centroid += S2::GetCentroid(S2PointSpan(vertices));
        break;
      default:
        GetChainVertices(shape, chain_id, &vertices);
        centroid += S2::GetCentroid(S2PointLoopSpan(vertices));
        break;
    }
  }
  return centroid;
}